

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

Own<capnp::ClientHook> __thiscall capnp::_::OrphanBuilder::asCapability(OrphanBuilder *this)

{
  SegmentBuilder *capTable;
  WirePointer *ref;
  WirePointer *pWVar1;
  OrphanBuilder *in_RSI;
  Own<capnp::ClientHook> OVar2;
  OrphanBuilder *this_local;
  
  capTable = in_RSI->segment;
  ref = (WirePointer *)in_RSI->capTable;
  pWVar1 = tagAsPtr(in_RSI);
  kj::MaxValue_::operator_cast_to_int((MaxValue_ *)&kj::maxValue);
  OVar2 = WireHelpers::readCapabilityPointer
                    ((SegmentReader *)this,(CapTableReader *)capTable,ref,(int)pWVar1);
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

kj::Own<ClientHook> OrphanBuilder::asCapability() const {
  return WireHelpers::readCapabilityPointer(segment, capTable, tagAsPtr(), kj::maxValue);
}